

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

BuiltinFunction Js::JavascriptLibrary::GetBuiltinFunctionForPropId(PropertyId id)

{
  BuiltinFunction local_9;
  PropertyId id_local;
  
  switch(id) {
  case 0x17:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptRegExp_SymbolSearch);
    break;
  default:
    BuiltinFunction::BuiltinFunction(&local_9,None);
    break;
  case 0x1d:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Abs);
    break;
  case 0x1e:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Acos);
    break;
  case 0x20:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Asin);
    break;
  case 0x21:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Atan);
    break;
  case 0x23:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Ceil);
    break;
  case 0x24:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Cos);
    break;
  case 0x25:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Exp);
    break;
  case 0x26:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Floor);
    break;
  case 0x27:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Log);
    break;
  case 0x2a:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Min);
    break;
  case 0x2c:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Pow);
    break;
  case 0x2d:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Random);
    break;
  case 0x2e:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Round);
    break;
  case 0x2f:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Sin);
    break;
  case 0x30:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Sqrt);
    break;
  case 0x31:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Tan);
    break;
  case 0x40:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Imul);
    break;
  case 0x42:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Fround);
    break;
  case 0x4e:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptFunction_Apply);
    break;
  case 0x51:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_At);
    break;
  case 0x5f:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_CharAt);
    break;
  case 0x60:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_CharCodeAt);
    break;
  case 0x61:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_CodePointAt);
    break;
  case 0x65:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Concat);
    break;
  case 0x83:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptRegExp_Exec);
    break;
  case 0x96:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_FromCharCode);
    break;
  case 0x97:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_FromCodePoint);
    break;
  case 0xb6:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptObject_HasOwn);
    break;
  case 0xb7:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptObject_HasOwnProperty);
    break;
  case 0xb8:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Includes);
    break;
  case 0xb9:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_IndexOf);
    break;
  case 0xbe:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_IsArray);
    break;
  case 0xcc:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Join);
    break;
  case 0xd0:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_LastIndexOf);
    break;
  case 0xd2:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Link);
    break;
  case 0xfe:
    BuiltinFunction::BuiltinFunction(&local_9,Math_Max);
    break;
  case 0x101:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Match);
    break;
  case 0x127:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Push);
    break;
  case 0x133:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Replace);
    break;
  case 0x136:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Reverse);
    break;
  case 0x13c:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Search);
    break;
  case 0x14e:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Shift);
    break;
  case 0x150:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Slice);
    break;
  case 0x155:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Splice);
    break;
  case 0x156:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Split);
    break;
  case 0x15e:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Substring);
    break;
  case 0x15f:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Substr);
    break;
  case 0x171:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_ToLocaleLowerCase);
    break;
  case 0x174:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_ToLocaleUpperCase);
    break;
  case 0x175:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_ToLowerCase);
    break;
  case 0x17b:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_ToUpperCase);
    break;
  case 0x17d:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_Trim);
    break;
  case 0x17e:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_TrimLeft);
    break;
  case 0x17f:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_TrimStart);
    break;
  case 0x180:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_TrimRight);
    break;
  case 0x181:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_TrimEnd);
    break;
  case 0x182:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_PadStart);
    break;
  case 0x183:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptString_PadEnd);
    break;
  case 0x18a:
    BuiltinFunction::BuiltinFunction(&local_9,JavascriptArray_Unshift);
  }
  return (BuiltinFunction)local_9._value;
}

Assistant:

BuiltinFunction JavascriptLibrary::GetBuiltinFunctionForPropId(PropertyId id)
    {
        switch (id)
        {
        case PropertyIds::abs:
            return BuiltinFunction::Math_Abs;

        // For now, avoid mapping Math.atan2 to a direct CRT call, as the
        // fast CRT helper doesn't handle denormals correctly.
        // case PropertyIds::atan2:
        //    return BuiltinFunction::Atan2;

        case PropertyIds::acos:
            return BuiltinFunction::Math_Acos;

        case PropertyIds::asin:
            return BuiltinFunction::Math_Asin;

        case PropertyIds::atan:
            return BuiltinFunction::Math_Atan;

        case PropertyIds::cos:
            return BuiltinFunction::Math_Cos;

        case PropertyIds::exp:
            return BuiltinFunction::Math_Exp;

        case PropertyIds::log:
            return BuiltinFunction::Math_Log;

        case PropertyIds::pow:
            return BuiltinFunction::Math_Pow;

        case PropertyIds::random:
            return BuiltinFunction::Math_Random;

        case PropertyIds::sin:
            return BuiltinFunction::Math_Sin;

        case PropertyIds::sqrt:
            return BuiltinFunction::Math_Sqrt;

        case PropertyIds::tan:
            return BuiltinFunction::Math_Tan;

        case PropertyIds::floor:
            return BuiltinFunction::Math_Floor;

        case PropertyIds::ceil:
            return BuiltinFunction::Math_Ceil;

        case PropertyIds::round:
            return BuiltinFunction::Math_Round;

         case PropertyIds::max:
            return BuiltinFunction::Math_Max;

        case PropertyIds::min:
            return BuiltinFunction::Math_Min;

        case PropertyIds::imul:
            return BuiltinFunction::Math_Imul;

        case PropertyIds::fround:
            return BuiltinFunction::Math_Fround;

        case PropertyIds::codePointAt:
            return BuiltinFunction::JavascriptString_CodePointAt;

        case PropertyIds::at:
            return BuiltinFunction::JavascriptArray_At;

        case PropertyIds::push:
            return BuiltinFunction::JavascriptArray_Push;

        case PropertyIds::concat:
            return BuiltinFunction::JavascriptArray_Concat;

        case PropertyIds::indexOf:
            return BuiltinFunction::JavascriptArray_IndexOf;

        case PropertyIds::includes:
            return BuiltinFunction::JavascriptArray_Includes;

        case PropertyIds::isArray:
            return BuiltinFunction::JavascriptArray_IsArray;

        case PropertyIds::join:
            return BuiltinFunction::JavascriptArray_Join;

        case PropertyIds::lastIndexOf:
            return BuiltinFunction::JavascriptArray_LastIndexOf;

        case PropertyIds::reverse:
            return BuiltinFunction::JavascriptArray_Reverse;

        case PropertyIds::shift:
            return BuiltinFunction::JavascriptArray_Shift;

        case PropertyIds::slice:
            return BuiltinFunction::JavascriptArray_Slice;

        case PropertyIds::splice:
            return BuiltinFunction::JavascriptArray_Splice;

        case PropertyIds::unshift:
            return BuiltinFunction::JavascriptArray_Unshift;

        case PropertyIds::apply:
            return BuiltinFunction::JavascriptFunction_Apply;

        case PropertyIds::charAt:
            return BuiltinFunction::JavascriptString_CharAt;

        case PropertyIds::charCodeAt:
            return BuiltinFunction::JavascriptString_CharCodeAt;

        case PropertyIds::fromCharCode:
            return BuiltinFunction::JavascriptString_FromCharCode;

        case PropertyIds::fromCodePoint:
                return BuiltinFunction::JavascriptString_FromCodePoint;

        case PropertyIds::link:
            return BuiltinFunction::JavascriptString_Link;

        case PropertyIds::match:
            return BuiltinFunction::JavascriptString_Match;

        case PropertyIds::replace:
            return BuiltinFunction::JavascriptString_Replace;

        case PropertyIds::search:
            return BuiltinFunction::JavascriptString_Search;

        case PropertyIds::_symbolSearch:
            return BuiltinFunction::JavascriptRegExp_SymbolSearch;

        case PropertyIds::split:
            return BuiltinFunction::JavascriptString_Split;

        case PropertyIds::substr:
            return BuiltinFunction::JavascriptString_Substr;

        case PropertyIds::substring:
            return BuiltinFunction::JavascriptString_Substring;

        case PropertyIds::toLocaleLowerCase:
            return BuiltinFunction::JavascriptString_ToLocaleLowerCase;

        case PropertyIds::toLocaleUpperCase:
            return BuiltinFunction::JavascriptString_ToLocaleUpperCase;

        case PropertyIds::toLowerCase:
            return BuiltinFunction::JavascriptString_ToLowerCase;

        case PropertyIds::toUpperCase:
            return BuiltinFunction::JavascriptString_ToUpperCase;

        case PropertyIds::trim:
            return BuiltinFunction::JavascriptString_Trim;

        case PropertyIds::trimLeft:
            return BuiltinFunction::JavascriptString_TrimLeft;

        case PropertyIds::trimStart:
            return BuiltinFunction::JavascriptString_TrimStart;

        case PropertyIds::trimRight:
            return BuiltinFunction::JavascriptString_TrimRight;

        case PropertyIds::trimEnd:
            return BuiltinFunction::JavascriptString_TrimEnd;

        case PropertyIds::padStart:
            return BuiltinFunction::JavascriptString_PadStart;

        case PropertyIds::padEnd:
            return BuiltinFunction::JavascriptString_PadEnd;

        case PropertyIds::exec:
            return BuiltinFunction::JavascriptRegExp_Exec;

        case PropertyIds::hasOwnProperty:
            return BuiltinFunction::JavascriptObject_HasOwnProperty;

        case PropertyIds::hasOwn:
            return BuiltinFunction::JavascriptObject_HasOwn;

        default:
            return BuiltinFunction::None;
        }
    }